

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

void pfr_free(PortFwdRecord *pfr)

{
  if (pfr->local != (PortListener *)0x0) {
    pfl_terminate(pfr->local);
  }
  safefree(pfr->saddr);
  safefree(pfr->daddr);
  safefree(pfr->sserv);
  safefree(pfr->dserv);
  safefree(pfr);
  return;
}

Assistant:

static void pfr_free(PortFwdRecord *pfr)
{
    /* Dispose of any listening socket. */
    if (pfr->local)
        pfl_terminate(pfr->local);

    sfree(pfr->saddr);
    sfree(pfr->daddr);
    sfree(pfr->sserv);
    sfree(pfr->dserv);
    sfree(pfr);
}